

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergefiles.c
# Opt level: O2

econf_err traverse_conf_dirs(econf_file ***key_files,char **config_dirs,size_t *size,char *path,
                            char *config_suffix,char *delim,char *comment,_Bool join_same_entries,
                            _Bool python_style,_func__Bool_char_ptr_void_ptr *callback,
                            void *callback_data)

{
  size_t sVar1;
  econf_file ***pppeVar2;
  uint uVar3;
  int iVar4;
  econf_err eVar5;
  size_t sVar6;
  size_t sVar7;
  char *__dest;
  char *__dest_00;
  char *pcVar8;
  econf_file **ppeVar9;
  dirent *__ptr;
  long lVar10;
  ulong uVar11;
  econf_file *local_60;
  dirent **de;
  char **local_50;
  econf_file ***local_48;
  size_t *local_40;
  char *local_38;
  
  if (config_dirs == (char **)0x0) {
    return ECONF_NOFILE;
  }
  lVar10 = 0;
  local_50 = config_dirs;
  local_48 = key_files;
  local_40 = size;
  local_38 = delim;
LAB_00105759:
  pcVar8 = local_50[lVar10];
  if (pcVar8 == (char *)0x0) {
    return ECONF_SUCCESS;
  }
  sVar6 = strlen(path);
  sVar7 = strlen(pcVar8);
  __dest = (char *)malloc(sVar6 + sVar7 + 1);
  if (__dest == (char *)0x0) {
    return ECONF_NOMEM;
  }
  __dest_00 = stpcpy(__dest,path);
  strcpy(__dest_00,pcVar8);
  eVar5 = ECONF_SUCCESS;
  uVar3 = scandir(__dest,(dirent ***)&de,(__selector *)0x0,alphasort);
  if (0 < (int)uVar3) {
    for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
      __ptr = de[uVar11];
      pcVar8 = __ptr->d_name;
      sVar6 = strlen(pcVar8);
      sVar7 = strlen(config_suffix);
      if (((sVar7 < sVar6) &&
          (iVar4 = strncmp(pcVar8 + (sVar6 - sVar7),config_suffix,sVar7), iVar4 == 0)) &&
         ((*pcVar8 != '.' ||
          ((__ptr->d_name[1] != '\0' && ((__ptr->d_name[1] != '.' || (__ptr->d_name[2] != '\0'))))))
         )) {
        pcVar8 = combine_strings(__dest,pcVar8,'/');
        local_60 = (econf_file *)0x0;
        eVar5 = econf_newKeyFile_with_options(&local_60,"");
        if (eVar5 != ECONF_SUCCESS) goto LAB_00105955;
        local_60->join_same_entries = join_same_entries;
        local_60->python_style = python_style;
        eVar5 = read_file_with_callback(&local_60,pcVar8,local_38,comment,callback,callback_data);
        free(pcVar8);
        pppeVar2 = local_48;
        if ((eVar5 != ECONF_SUCCESS) || (local_60 == (econf_file *)0x0)) goto LAB_0010592f;
        local_60->on_merge_delete = true;
        sVar1 = *local_40;
        (*local_48)[sVar1 - 1] = local_60;
        ppeVar9 = *local_48;
        *local_40 = sVar1 + 1;
        ppeVar9 = (econf_file **)realloc(ppeVar9,sVar1 * 8 + 8);
        *pppeVar2 = ppeVar9;
        __ptr = de[uVar11];
      }
      free(__ptr);
    }
    free(de);
    eVar5 = ECONF_SUCCESS;
  }
  goto LAB_00105955;
LAB_0010592f:
  for (; uVar3 != uVar11; uVar11 = uVar11 + 1) {
    free(de[uVar11]);
  }
  free(de);
LAB_00105955:
  lVar10 = lVar10 + 1;
  free(__dest);
  if (eVar5 != ECONF_SUCCESS) {
    return eVar5;
  }
  goto LAB_00105759;
}

Assistant:

econf_err traverse_conf_dirs(econf_file ***key_files,
			     char *config_dirs[],
			     size_t *size, const char *path,
			     const char *config_suffix,
			     const char *delim, const char *comment,
	                     const bool join_same_entries, const bool python_style,
			     bool (*callback)(const char *filename, const void *data),
			     const void *callback_data) {
  int i;

  if (config_dirs == NULL)
    return ECONF_NOFILE;

  i = 0;
  while (config_dirs[i] != NULL) {
    char *fulldir, *cp;

    if ((fulldir = malloc (strlen(path) + strlen (config_dirs[i]) + 1)) == NULL)
      return ECONF_NOMEM;

    cp = stpcpy (fulldir, path);
    stpcpy (cp, config_dirs[i++]);
    econf_err error = check_conf_dir(key_files, size,
				     fulldir, config_suffix, delim, comment,
	                             join_same_entries, python_style,
				     callback, callback_data);
    free (fulldir);
    if (error)
      return error;
  }
  return ECONF_SUCCESS;
}